

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Sym * __thiscall GlobOpt::SetSymStore(GlobOpt *this,ValueInfo *valueInfo,Sym *sym)

{
  Sym *sym_00;
  StackSym *stackSym;
  
  if ((sym->m_kind == SymKindStack) && (((ulong)sym[1]._vptr_Sym & 0x10000) != 0)) {
    sym = &StackSym::GetVarEquivSym((StackSym *)sym,this->func)->super_Sym;
  }
  sym_00 = valueInfo->symStore;
  if ((sym_00 == (Sym *)0x0) || (sym_00->m_kind == SymKindProperty)) {
    GlobOptBlockData::SetChangedSym(&this->currentBlock->globOptData,sym_00);
    ValueInfo::SetSymStore(valueInfo,sym);
  }
  return &((StackSym *)sym)->super_Sym;
}

Assistant:

Sym *
GlobOpt::SetSymStore(ValueInfo *valueInfo, Sym *sym)
{
    if (sym->IsStackSym())
    {
        StackSym *stackSym = sym->AsStackSym();

        if (stackSym->IsTypeSpec())
        {
            stackSym = stackSym->GetVarEquivSym(this->func);
            sym = stackSym;
        }
    }
    if (valueInfo->GetSymStore() == nullptr || valueInfo->GetSymStore()->IsPropertySym())
    {
        SetSymStoreDirect(valueInfo, sym);
    }

    return sym;
}